

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O2

Fraig_NodeVec_t * Fraig_NodeVecAlloc(int nCap)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  int iVar3;
  
  pFVar1 = (Fraig_NodeVec_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < nCap - 1U) {
    iVar3 = nCap;
  }
  pFVar1->nSize = 0;
  pFVar1->nCap = iVar3;
  if (iVar3 == 0) {
    ppFVar2 = (Fraig_Node_t **)0x0;
  }
  else {
    ppFVar2 = (Fraig_Node_t **)malloc((long)iVar3 << 3);
  }
  pFVar1->pArray = ppFVar2;
  return pFVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates a vector with the given capacity.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fraig_NodeVec_t * Fraig_NodeVecAlloc( int nCap )
{
    Fraig_NodeVec_t * p;
    p = ABC_ALLOC( Fraig_NodeVec_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( Fraig_Node_t *, p->nCap ) : NULL;
    return p;
}